

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::update_state_list(torrent *this)

{
  bool in;
  bool in_00;
  uint uVar1;
  bool in_01;
  
  if (((this->field_0x600 & 1) == 0) || ((this->m_error).failed_ != false)) {
LAB_0030c2ed:
    in = false;
    in_00 = false;
  }
  else {
    uVar1 = (uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39) & 7;
    if (3 < uVar1 - 2) {
      if (uVar1 == 1) {
        in_01 = true;
        in = false;
        in_00 = false;
        goto LAB_0030c2f4;
      }
      goto LAB_0030c2ed;
    }
    in = is_finished(this);
    in_00 = !in;
  }
  in_01 = false;
LAB_0030c2f4:
  update_list(this,(torrent_list_index_t)0x5,in_00);
  update_list(this,(torrent_list_index_t)0x6,in);
  update_list(this,(torrent_list_index_t)0x7,in_01);
  return;
}

Assistant:

void torrent::update_state_list()
	{
		bool is_checking = false;
		bool is_downloading = false;
		bool is_seeding = false;

		if (is_auto_managed() && !has_error())
		{
			if (m_state == torrent_status::checking_files)
			{
				is_checking = true;
			}
			else if (m_state == torrent_status::downloading_metadata
				|| m_state == torrent_status::downloading
				|| m_state == torrent_status::finished
				|| m_state == torrent_status::seeding)
			{
				// torrents that are started (not paused) and
				// inactive are not part of any list. They will not be touched because
				// they are inactive
				if (is_finished())
					is_seeding = true;
				else
					is_downloading = true;
			}
		}

		update_list(aux::session_interface::torrent_downloading_auto_managed
			, is_downloading);
		update_list(aux::session_interface::torrent_seeding_auto_managed
			, is_seeding);
		update_list(aux::session_interface::torrent_checking_auto_managed
			, is_checking);
	}